

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *window;
  ImGuiID id;
  float *pfVar4;
  uint flags;
  size_t idx;
  float fVar5;
  ImS64 scroll;
  ImRect bb;
  long local_48;
  ImRect local_40;
  
  window = GImGui->CurrentWindow;
  id = GetWindowScrollbarID(window,axis);
  KeepAliveID(id);
  local_40 = GetWindowScrollbarRect(window,axis);
  if (axis == ImGuiAxis_X) {
    flags = (window->ScrollbarY ^ 1) << 7 | 0x140;
  }
  else {
    flags = (window->ScrollbarX ^ 1) * 0x80 + (uint)((window->Flags & 0x401U) == 1) * 0x20 + 0x100;
  }
  idx = (size_t)axis;
  pfVar4 = ImVec2::operator[](&(window->InnerRect).Max,idx);
  fVar5 = *pfVar4;
  pfVar4 = ImVec2::operator[](&(window->InnerRect).Min,idx);
  fVar1 = *pfVar4;
  pfVar4 = ImVec2::operator[](&window->ContentSize,idx);
  fVar2 = *pfVar4;
  pfVar4 = ImVec2::operator[](&window->WindowPadding,idx);
  fVar3 = *pfVar4;
  pfVar4 = ImVec2::operator[](&window->Scroll,idx);
  local_48 = (long)*pfVar4;
  ScrollbarEx(&local_40,id,axis,&local_48,(long)(fVar5 - fVar1),(long)(fVar3 + fVar3 + fVar2),flags)
  ;
  fVar5 = (float)local_48;
  pfVar4 = ImVec2::operator[](&window->Scroll,idx);
  *pfVar4 = fVar5;
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ImS64 scroll = (ImS64)window->Scroll[axis];
    ScrollbarEx(bb, id, axis, &scroll, (ImS64)size_avail, (ImS64)size_contents, rounding_corners);
    window->Scroll[axis] = (float)scroll;
}